

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::~IfcSlabType(IfcSlabType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x975fc0;
  *(undefined8 *)&this->field_0x30 = 0x9760d8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x975fe8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x976010;
  *(undefined8 *)&this[-1].field_0x138 = 0x976038;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x976060;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x976088;
  *(undefined8 *)this = 0x9760b0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x9763a0;
  *(undefined8 *)&this->field_0x30 = 0x976468;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9763c8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9763f0;
  *(undefined8 *)&this[-1].field_0x138 = 0x976418;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x976440;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00976100);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}